

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* flatbuffers::(anonymous_namespace)::RustKeywords_abi_cxx11_(void)

{
  long lVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_9ac;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  allocator<char> local_9a8;
  allocator<char> local_9a7;
  allocator<char> local_9a6;
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  allocator<char> local_9a0;
  allocator<char> local_99f;
  allocator<char> local_99e;
  allocator<char> local_99d;
  allocator<char> local_99c;
  allocator<char> local_99b;
  allocator<char> local_99a;
  allocator<char> local_999;
  allocator<char> local_998;
  allocator<char> local_997;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  allocator<char> local_990;
  allocator<char> local_98f;
  allocator<char> local_98e;
  allocator<char> local_98d;
  allocator<char> local_98c;
  allocator<char> local_98b;
  allocator<char> local_98a;
  allocator<char> local_989;
  allocator<char> local_988;
  allocator<char> local_987;
  allocator<char> local_986;
  allocator<char> local_985;
  allocator<char> local_984;
  allocator<char> local_983;
  allocator<char> local_982;
  allocator<char> local_981;
  allocator<char> local_980;
  allocator<char> local_97f;
  allocator<char> local_97e;
  allocator<char> local_97d;
  allocator<char> local_97c;
  allocator<char> local_97b;
  allocator<char> local_97a;
  allocator<char> local_979;
  allocator<char> local_978;
  allocator<char> local_977;
  allocator<char> local_976;
  allocator<char> local_975;
  allocator<char> local_974;
  allocator<char> local_973;
  allocator<char> local_972;
  allocator<char> local_971;
  allocator<char> local_970;
  allocator<char> local_96f;
  allocator<char> local_96e;
  allocator<char> local_96d;
  allocator<char> local_96c;
  allocator<char> local_96b;
  allocator<char> local_96a;
  allocator<char> local_969;
  allocator<char> local_968;
  allocator<char> local_967;
  allocator<char> local_966;
  allocator<char> local_965;
  allocator<char> local_964;
  allocator<char> local_963;
  allocator<char> local_962;
  allocator<char> local_961;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"as",&local_961);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"break",&local_962);
  std::__cxx11::string::string<std::allocator<char>>(local_920,"const",&local_963);
  std::__cxx11::string::string<std::allocator<char>>(local_900,"continue",&local_964);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"crate",&local_965);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"else",&local_966);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"enum",&local_967);
  std::__cxx11::string::string<std::allocator<char>>(local_880,"extern",&local_968);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"false",&local_969);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"fn",&local_96a);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"for",&local_96b);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"if",&local_96c);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"impl",&local_96d);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"in",&local_96e);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"let",&local_96f);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"loop",&local_970);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"match",&local_971);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"mod",&local_972);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"move",&local_973);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"mut",&local_974);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"pub",&local_975);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"ref",&local_976);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"return",&local_977);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"Self",&local_978);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"self",&local_979);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"static",&local_97a);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"struct",&local_97b);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"super",&local_97c);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"trait",&local_97d);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"true",&local_97e);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"type",&local_97f);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"unsafe",&local_980);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"use",&local_981);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"where",&local_982);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"while",&local_983);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"abstract",&local_984);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"alignof",&local_985);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"become",&local_986);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"box",&local_987);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"do",&local_988);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"final",&local_989);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"macro",&local_98a);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"offsetof",&local_98b);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"override",&local_98c);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"priv",&local_98d);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"proc",&local_98e);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"pure",&local_98f);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"sizeof",&local_990);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"typeof",&local_991);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"unsized",&local_992);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"virtual",&local_993);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"yield",&local_994);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"std",&local_995);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"usize",&local_996);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"isize",&local_997);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"u8",&local_998);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"i8",&local_999);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"u16",&local_99a);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"i16",&local_99b);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"u32",&local_99c);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"i32",&local_99d);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u64",&local_99e);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"i64",&local_99f);
  std::__cxx11::string::string<std::allocator<char>>(local_180,"u128",&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"i128",&local_9a1);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"f32",&local_9a2);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"f64",&local_9a3);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"follow",&local_9a4);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"push",&local_9a5);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"to_little_endian",&local_9a6);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"from_little_endian",&local_9a7);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"ENUM_MAX",&local_9a8);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"ENUM_MIN",&local_9a9);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"ENUM_VALUES",&local_9aa);
  __l._M_len = 0x4a;
  __l._M_array = &local_960;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_RDI,__l,&local_9ab,&local_9ac);
  lVar1 = 0x920;
  do {
    std::__cxx11::string::~string((string *)((long)&local_960._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return in_RDI;
}

Assistant:

static std::set<std::string> RustKeywords() {
  return {
    // https://doc.rust-lang.org/book/second-edition/appendix-01-keywords.html
    "as",
    "break",
    "const",
    "continue",
    "crate",
    "else",
    "enum",
    "extern",
    "false",
    "fn",
    "for",
    "if",
    "impl",
    "in",
    "let",
    "loop",
    "match",
    "mod",
    "move",
    "mut",
    "pub",
    "ref",
    "return",
    "Self",
    "self",
    "static",
    "struct",
    "super",
    "trait",
    "true",
    "type",
    "unsafe",
    "use",
    "where",
    "while",
    // future possible keywords
    "abstract",
    "alignof",
    "become",
    "box",
    "do",
    "final",
    "macro",
    "offsetof",
    "override",
    "priv",
    "proc",
    "pure",
    "sizeof",
    "typeof",
    "unsized",
    "virtual",
    "yield",
    // other rust terms we should not use
    "std",
    "usize",
    "isize",
    "u8",
    "i8",
    "u16",
    "i16",
    "u32",
    "i32",
    "u64",
    "i64",
    "u128",
    "i128",
    "f32",
    "f64",
    // Terms that we use ourselves
    "follow",
    "push",
    "to_little_endian",
    "from_little_endian",
    "ENUM_MAX",
    "ENUM_MIN",
    "ENUM_VALUES",
  };
}